

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O2

int xmlUCSIsCatCo(int code)

{
  uint uVar1;
  
  uVar1 = 1;
  if ((((code != 0xe000) && (code != 0xf8ff)) && (code != 0xf0000)) &&
     ((code != 0xffffd && (code != 0x100000)))) {
    uVar1 = (uint)(code == 0x10fffd);
  }
  return uVar1;
}

Assistant:

int
xmlUCSIsCatCo(int code) {
    return((code == 0xe000) ||
           (code == 0xf8ff) ||
           (code == 0xf0000) ||
           (code == 0xffffd) ||
           (code == 0x100000) ||
           (code == 0x10fffd));
}